

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall
Tjen::Node::Transition::Transition
          (Transition *this,Node *from,Node *to,char *oldStack,string *newStack,char input)

{
  (this->newstack)._M_dataplus._M_p = (pointer)&(this->newstack).field_2;
  (this->newstack)._M_string_length = 0;
  (this->newstack).field_2._M_local_buf[0] = '\0';
  this->from = from;
  std::__cxx11::string::_M_assign((string *)&this->newstack);
  this->oldStack = *oldStack;
  this->to = to;
  this->input = input;
  return;
}

Assistant:

Tjen::Node::Transition::Transition(Node* from, Node* to, char &oldStack, std::string &newStack, const char input) {
    this->from = from;
    this->newstack = newStack;
    this->oldStack = oldStack;
    this->to = to;
    this->input = input;
}